

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * google::protobuf::compiler::php::anon_unknown_2::PhpName
                   (string *__return_storage_ptr__,string *full_name,Options *options)

{
  char cVar1;
  string *extraout_RAX;
  long *plVar2;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *psVar3;
  long *plVar4;
  long *plVar5;
  ulong uVar6;
  string segment;
  long *local_b8;
  long local_a8;
  long lStack_a0;
  anon_unknown_2 *local_98;
  string *local_90;
  anon_unknown_2 local_88 [16];
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  if (((ulong)options & 1) == 0) {
    local_98 = local_88;
    local_90 = (string *)0x0;
    local_88[0] = (anon_unknown_2)0x0;
    local_58 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (full_name->_M_string_length != 0) {
      uVar6 = 0;
      do {
        cVar1 = (full_name->_M_dataplus)._M_p[uVar6];
        if ((cVar1 < 'a') && (cVar1 == '.')) {
          ClassNamePrefix(&local_50,local_98,local_90);
          plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_98);
          psVar3 = (string *)(plVar2 + 2);
          if ((string *)*plVar2 == psVar3) {
            local_78._16_8_ = (psVar3->_M_dataplus)._M_p;
            local_78._24_8_ = plVar2[3];
            local_78._0_8_ = (string *)(local_78 + 0x10);
          }
          else {
            local_78._16_8_ = (psVar3->_M_dataplus)._M_p;
            local_78._0_8_ = (string *)*plVar2;
          }
          local_78._8_8_ = plVar2[1];
          *plVar2 = (long)psVar3;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          plVar2 = (long *)std::__cxx11::string::_M_replace_aux
                                     ((ulong)local_78,local_78._8_8_,0,'\x01');
          plVar4 = plVar2 + 2;
          if ((long *)*plVar2 == plVar4) {
            local_a8 = *plVar4;
            lStack_a0 = plVar2[3];
            local_b8 = &local_a8;
          }
          else {
            local_a8 = *plVar4;
            local_b8 = (long *)*plVar2;
          }
          *plVar2 = (long)plVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
          if (local_b8 != &local_a8) {
            operator_delete(local_b8);
          }
          if ((string *)local_78._0_8_ != (string *)(local_78 + 0x10)) {
            operator_delete((void *)local_78._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)local_90,0x3d75d9);
        }
        else {
          std::__cxx11::string::push_back((char)&local_98);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < full_name->_M_string_length);
    }
    ClassNamePrefix((string *)local_78,local_98,local_90);
    plVar2 = (long *)std::__cxx11::string::_M_append(local_78,(ulong)local_98);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_a8 = *plVar4;
      lStack_a0 = plVar2[3];
      plVar5 = &local_a8;
    }
    else {
      local_a8 = *plVar4;
      plVar5 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)plVar5);
    if (plVar5 != &local_a8) {
      operator_delete(plVar5);
    }
    psVar3 = (string *)(local_78 + 0x10);
    if ((string *)local_78._0_8_ != psVar3) {
      operator_delete((void *)local_78._0_8_);
      psVar3 = extraout_RAX_00;
    }
    if (local_98 != local_88) {
      operator_delete(local_98);
      psVar3 = extraout_RAX_01;
    }
    return psVar3;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,kDescriptorPackageName_abi_cxx11_._M_dataplus._M_p,
             kDescriptorPackageName_abi_cxx11_._M_dataplus._M_p +
             kDescriptorPackageName_abi_cxx11_._M_string_length);
  return extraout_RAX;
}

Assistant:

std::string PhpName(const std::string& full_name, const Options& options) {
  if (options.is_descriptor) {
    return kDescriptorPackageName;
  }

  std::string segment;
  std::string result;
  bool cap_next_letter = true;
  for (int i = 0; i < full_name.size(); i++) {
    if ('a' <= full_name[i] && full_name[i] <= 'z' && cap_next_letter) {
      segment += full_name[i] + ('A' - 'a');
      cap_next_letter = false;
    } else if (full_name[i] == '.') {
      result += ClassNamePrefix(segment) + segment + '\\';
      segment = "";
      cap_next_letter = true;
    } else {
      segment += full_name[i];
      cap_next_letter = false;
    }
  }
  result += ClassNamePrefix(segment) + segment;
  return result;
}